

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O2

int SDL_ConvertAudio(SDL12_AudioCVT *cvt12)

{
  SDL20_ConvertAudio_t p_Var1;
  int iVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  SDL_AudioCVT local_a8;
  
  p_Var1 = SDL20_ConvertAudio;
  if (cvt12->buf != (Uint8 *)0x0) {
    if (WantCompatibilityAudioCVT == SDL_FALSE) {
      (*SDL20_memset)(&local_a8,0,0x80);
      local_a8.needed = cvt12->needed;
      local_a8.src_format = cvt12->src_format;
      local_a8.dst_format = cvt12->dst_format;
      local_a8.rate_incr = cvt12->rate_incr;
      local_a8.buf = cvt12->buf;
      local_a8.len = cvt12->len;
      local_a8.len_cvt = cvt12->len_cvt;
      local_a8.len_mult = cvt12->len_mult;
      local_a8.len_ratio = cvt12->len_ratio;
      (*SDL20_memcpy)(local_a8.filters,cvt12->filters,0x50);
      local_a8.filter_index = cvt12->filter_index;
      iVar2 = (*p_Var1)(&local_a8);
      AudioCVT20to12(&local_a8,cvt12);
    }
    else {
      cvt12->len_cvt = cvt12->len;
      cvt12->filter_index = 0;
      iVar2 = 0;
      if (cvt12->filters[0] != (SDL12_AudioCVTFilter)0x0) {
        (*cvt12->filters[0])(cvt12,cvt12->src_format);
        iVar2 = 0;
      }
    }
    return iVar2;
  }
  iVar2 = (*SDL20_SetError)("No buffer allocated for conversion",in_RSI,in_RDX,SDL20_SetError);
  return iVar2;
}

Assistant:

SDLCALL
SDL_ConvertAudio(SDL12_AudioCVT *cvt12)
{
    int retval = 0;

    if (!cvt12->buf) {  /* neither SDL 1.2 nor 2.0 makes sure cvt12 isn't NULL here.  :/  */
        retval = SDL20_SetError("No buffer allocated for conversion");
    } else if (!WantCompatibilityAudioCVT) {
        SDL_AudioCVT cvt20;
        retval = SDL20_ConvertAudio(AudioCVT12to20(cvt12, &cvt20));
        AudioCVT20to12(&cvt20, cvt12);
    } else {
        cvt12->len_cvt = cvt12->len;
        cvt12->filter_index = 0;
        if (cvt12->filters[0]) {
            cvt12->filters[0](cvt12, cvt12->src_format);
        }
    }

    return retval;
}